

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderApiTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::logVertexFragmentProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,Shader *vertShader,
               Shader *fragShader)

{
  bool linkOk;
  string *linkInfoLog;
  LogShaderProgram local_58;
  Shader *local_30;
  Shader *fragShader_local;
  Shader *vertShader_local;
  Program *program_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  
  local_30 = fragShader;
  fragShader_local = vertShader;
  vertShader_local = (Shader *)program;
  program_local = (Program *)renderCtx;
  renderCtx_local = (RenderContext *)log;
  linkOk = glu::Program::getLinkStatus(program);
  linkInfoLog = glu::Program::getInfoLog_abi_cxx11_((Program *)vertShader_local);
  tcu::LogShaderProgram::LogShaderProgram(&local_58,linkOk,linkInfoLog);
  tcu::TestLog::operator<<(log,&local_58);
  tcu::LogShaderProgram::~LogShaderProgram(&local_58);
  logShader((TestLog *)renderCtx_local,(RenderContext *)program_local,fragShader_local);
  logShader((TestLog *)renderCtx_local,(RenderContext *)program_local,local_30);
  tcu::TestLog::operator<<
            ((TestLog *)renderCtx_local,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  return;
}

Assistant:

void logVertexFragmentProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, glu::Shader& vertShader, glu::Shader& fragShader)
{
	DE_ASSERT(vertShader.getType() == glu::SHADERTYPE_VERTEX && fragShader.getType() == glu::SHADERTYPE_FRAGMENT);

	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	logShader(log, renderCtx, vertShader);
	logShader(log, renderCtx, fragShader);

	log << TestLog::EndShaderProgram;
}